

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int verify_certificate(ptls_verify_certificate_t *_self,ptls_t *tls,
                      _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier,void **verify_data,
                      ptls_iovec_t *certs,size_t num_certs)

{
  int iVar1;
  X509 *x509;
  X509 *pXVar2;
  EVP_PKEY *pEVar3;
  X509 *interm;
  size_t i;
  X509_STORE_CTX *pXStack_58;
  int ret;
  X509_STORE_CTX *verify_ctx;
  stack_st_X509 *chain;
  X509 *cert;
  ptls_openssl_verify_certificate_t *self;
  size_t num_certs_local;
  ptls_iovec_t *certs_local;
  void **verify_data_local;
  _func_int_void_ptr_ptls_iovec_t_ptls_iovec_t **verifier_local;
  ptls_t *tls_local;
  ptls_verify_certificate_t *_self_local;
  
  pXStack_58 = (X509_STORE_CTX *)0x0;
  if (num_certs == 0) {
    __assert_fail("num_certs != 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/mattcaswell[P]picotls/lib/openssl.c"
                  ,0x2fd,
                  "int verify_certificate(ptls_verify_certificate_t *, ptls_t *, int (**)(void *, ptls_iovec_t, ptls_iovec_t), void **, ptls_iovec_t *, size_t)"
                 );
  }
  x509 = (X509 *)to_x509(*certs);
  if (x509 == (X509 *)0x0) {
    i._4_4_ = 0x2a;
    goto LAB_001057ee;
  }
  if (_self[1].cb !=
      (_func_int_st_ptls_verify_certificate_t_ptr_ptls_t_ptr__func_int_void_ptr_ptls_iovec_t_ptls_iovec_t_ptr_ptr_void_ptr_ptr_ptls_iovec_t_ptr_size_t
       *)0x0) {
    for (interm = (X509 *)0x1; interm != (X509 *)num_certs; interm = interm + 1) {
      pXVar2 = to_x509(certs[(long)interm]);
      if (pXVar2 == (X509 *)0x0) {
        i._4_4_ = 0x2a;
        goto LAB_001057ee;
      }
    }
    pXStack_58 = X509_STORE_CTX_new();
    if (pXStack_58 == (X509_STORE_CTX *)0x0) {
      i._4_4_ = 0x201;
      goto LAB_001057ee;
    }
    iVar1 = X509_STORE_CTX_init(pXStack_58,(X509_STORE *)_self[1].cb,x509,(stack_st_X509 *)0x0);
    if (iVar1 != 1) {
      i._4_4_ = 0x203;
      goto LAB_001057ee;
    }
    X509_STORE_CTX_set_purpose(pXStack_58,1);
    iVar1 = X509_verify_cert(pXStack_58);
    if (iVar1 != 1) {
      iVar1 = X509_STORE_CTX_get_error(pXStack_58);
      if (iVar1 == 10) {
        i._4_4_ = 0x2d;
      }
      else if (iVar1 == 0x11) {
        i._4_4_ = 0x201;
      }
      else if (iVar1 == 0x17) {
        i._4_4_ = 0x2c;
      }
      else {
        i._4_4_ = 0x2e;
      }
      goto LAB_001057ee;
    }
  }
  i._4_4_ = 0;
  pEVar3 = X509_get_pubkey(x509);
  *verify_data = pEVar3;
  if (pEVar3 == (EVP_PKEY *)0x0) {
    i._4_4_ = 0x2a;
  }
  else {
    *verifier = verify_sign;
  }
LAB_001057ee:
  if (pXStack_58 != (X509_STORE_CTX *)0x0) {
    X509_STORE_CTX_free(pXStack_58);
  }
  if (x509 != (X509 *)0x0) {
    X509_free(x509);
  }
  return i._4_4_;
}

Assistant:

static int verify_certificate(ptls_verify_certificate_t *_self, ptls_t *tls, int (**verifier)(void *, ptls_iovec_t, ptls_iovec_t),
                              void **verify_data, ptls_iovec_t *certs, size_t num_certs)
{
    ptls_openssl_verify_certificate_t *self = (ptls_openssl_verify_certificate_t *)_self;
    X509 *cert = NULL;
    STACK_OF(X509) *chain = NULL;
    X509_STORE_CTX *verify_ctx = NULL;
    int ret = 0;

    assert(num_certs != 0);

    if ((cert = to_x509(certs[0])) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }

    if (self->cert_store != NULL) {
        size_t i;
        for (i = 1; i != num_certs; ++i) {
            X509 *interm = to_x509(certs[i]);
            if (interm == NULL) {
                ret = PTLS_ALERT_BAD_CERTIFICATE;
                goto Exit;
            }
        }
        if ((verify_ctx = X509_STORE_CTX_new()) == NULL) {
            ret = PTLS_ERROR_NO_MEMORY;
            goto Exit;
        }
        if (X509_STORE_CTX_init(verify_ctx, self->cert_store, cert, chain) != 1) {
            ret = PTLS_ERROR_LIBRARY;
            goto Exit;
        }
        X509_STORE_CTX_set_purpose(verify_ctx, X509_PURPOSE_SSL_CLIENT);
        if (X509_verify_cert(verify_ctx) == 1) {
            ret = 0;
        } else {
            switch (X509_STORE_CTX_get_error(verify_ctx)) {
            case X509_V_ERR_OUT_OF_MEM:
                ret = PTLS_ERROR_NO_MEMORY;
                goto Exit;
            case X509_V_ERR_CERT_REVOKED:
                ret = PTLS_ALERT_CERTIFICATE_REVOKED;
                goto Exit;
            case X509_V_ERR_CERT_HAS_EXPIRED:
                ret = PTLS_ALERT_CERTIFICATE_EXPIRED;
                goto Exit;
            default:
                ret = PTLS_ALERT_CERTIFICATE_UNKNOWN;
                goto Exit;
            }
        }
    }

    if ((*verify_data = X509_get_pubkey(cert)) == NULL) {
        ret = PTLS_ALERT_BAD_CERTIFICATE;
        goto Exit;
    }
    *verifier = verify_sign;

Exit:
    if (verify_ctx != NULL)
        X509_STORE_CTX_free(verify_ctx);
    if (chain != NULL)
        sk_X509_free(chain);
    if (cert != NULL)
        X509_free(cert);
    return ret;
}